

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<float,_3,_3>::Matrix(Matrix<float,_3,_3> *this,Vector<float,_3> *src)

{
  long lVar1;
  int row;
  long lVar2;
  long lVar3;
  float fVar4;
  
  Vector<tcu::Vector<float,_3>,_3>::Vector(&this->m_data);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x24; lVar3 = lVar3 + 0xc) {
      fVar4 = 0.0;
      if (lVar1 == lVar3) {
        fVar4 = src->m_data[lVar2];
      }
      *(float *)((long)this + lVar3) = fVar4;
    }
    this = (Matrix<float,_3,_3> *)((long)this + 4);
    lVar1 = lVar1 + 0xc;
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const Vector<T, Rows>& src)
{
	DE_STATIC_ASSERT(Rows == Cols);
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? src.m_data[row] : T(0);
}